

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O2

QString * __thiscall
ProjectBuilderMakefileGenerator::keyFor
          (QString *__return_storage_ptr__,ProjectBuilderMakefileGenerator *this,QString *block)

{
  QMakeProject *this_00;
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  bool bVar4;
  QString *pQVar5;
  QHash<QString,_QString> *this_01;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QArrayDataPointer<char> local_a0;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_UnixMakefileGenerator).super_MakefileGenerator.project;
  QString::QString((QString *)&local_58,"no_pb_munge_key");
  bVar4 = QMakeProject::isActiveConfig(this_00,(QString *)&local_58,false);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (bVar4) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&block->d);
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    this_01 = &this->keys;
    bVar4 = QHash<QString,_QString>::contains(this_01,block);
    if (bVar4) {
      pQVar5 = QHash<QString,_QString>::operator[](this_01,block);
      QString::operator=(__return_storage_ptr__,(QString *)pQVar5);
    }
    else {
      QString::toUtf8_helper((QString *)&local_a0);
      local_58.size = -0x5555555555555556;
      local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_58.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      QVar6.m_data = (storage_type *)local_a0.size;
      QVar6.m_size = (qsizetype)&local_58;
      QCryptographicHash::hash(QVar6,(Algorithm)local_a0.ptr);
      QByteArray::toHex((char)&local_70);
      QString::fromLatin1<void>((QString *)&local_88,(QByteArray *)&local_70);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_70);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
      QString::left((QString *)&local_70,(QString *)&local_88,0x18);
      QString::toUpper_helper((QString *)&local_58);
      pDVar2 = (__return_storage_ptr__->d).d;
      pcVar3 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_58.d;
      (__return_storage_ptr__->d).ptr = local_58.ptr;
      qVar1 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_58.size;
      local_58.d = pDVar2;
      local_58.ptr = pcVar3;
      local_58.size = qVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_a0);
      QHash<QString,QString>::emplace<QString_const&>
                ((QHash<QString,QString> *)this_01,block,__return_storage_ptr__);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString
ProjectBuilderMakefileGenerator::keyFor(const QString &block)
{
#if 1 //This make this code much easier to debug..
    if(project->isActiveConfig("no_pb_munge_key"))
       return block;
#endif
    QString ret;
    if(!keys.contains(block)) {
        ret = qtSha1(block.toUtf8()).left(24).toUpper();
        keys.insert(block, ret);
    } else {
        ret = keys[block];
    }
    return ret;
}